

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O1

uint Kernel::
     FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::
     Bucket::hash(Term *t)

{
  uint unaff_EBP;
  char cVar1;
  char local_30 [4];
  uint local_2c;
  char local_28 [4];
  uint local_24;
  char local_20 [4];
  uint local_1c;
  
  NumTraits<Kernel::RationalConstantType>::
  ifLinMul<Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::Bucket::hash(Kernel::Term*)::_lambda(auto:1&,auto:2)_1_>
            (local_20,t);
  NumTraits<Kernel::RationalConstantType>::
  ifFloor<Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::Bucket::hash(Kernel::Term*)::_lambda(auto:1)_1_>
            (local_28,t);
  if (local_20[0] == '\x01') {
    cVar1 = '\x01';
    unaff_EBP = local_1c;
  }
  else {
    cVar1 = local_28[0];
    if (local_28[0] == '\x01') {
      unaff_EBP = local_24;
    }
  }
  NumTraits<Kernel::RationalConstantType>::
  ifAdd<Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::Bucket::hash(Kernel::Term*)::_lambda(auto:1,auto:2)_1_>
            (local_30,t);
  if ((cVar1 == '\0') && (cVar1 = local_30[0], local_30[0] == '\x01')) {
    unaff_EBP = local_2c;
  }
  if (cVar1 == '\0') {
    unaff_EBP = t->_functor * 2;
  }
  return unaff_EBP;
}

Assistant:

static unsigned hash(Term* t) { 
      return ASig::ifLinMul(t, [](auto& k, auto t) { return hash(t.term()); })
          || ASig::ifFloor(t, [](auto t) { return 2 * hash(t.term()) + 1; })
          || ASig::ifAdd(t, [](auto l, auto r) { return hash(l.term()) + hash(r.term()); })
          || [&]() { return 2 * t->functor(); };
    }